

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datastructure.h
# Opt level: O1

bool next_combination<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                index,unsigned_long k,unsigned_long n)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  uVar1 = index._M_current[k - 1];
  if (uVar1 < n) {
    if ((ulong)uVar1 < n - 1) {
      index._M_current[k - 1] = uVar1 + 1;
      return true;
    }
    if (k != 1) {
      lVar2 = k - 2;
      if (lVar2 != 0) {
        do {
          if (index._M_current[lVar2] != index._M_current[lVar2 + 1] - 1) goto LAB_0010c275;
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
        lVar2 = 0;
      }
      if (*index._M_current != index._M_current[1] - 1) {
LAB_0010c275:
        index._M_current[lVar2] = index._M_current[lVar2] + 1;
        if (k <= lVar2 + 1U) {
          return true;
        }
        uVar1 = index._M_current[lVar2];
        lVar3 = 1;
        do {
          (index._M_current + lVar2)[lVar3] = uVar1 + (int)lVar3;
          lVar3 = lVar3 + 1;
        } while (k - lVar2 != lVar3);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool next_combination(RandomAccessIterator index, uint k, uint n) {
    auto &last = index[k-1];
    if (last >= n) return false;
    if (last < n - 1) {
        ++last;
        return true;
    }
    if (k == 1) return false;
    uint i = k - 2;
    while (i > 0 && index[i] == index[i+1] - 1) --i;
    if (i == 0 && index[i] == index[i+1] - 1) return false;
    ++index[i];
    while (++i < k) {
        index[i] = index[i-1] + 1;
    }
    return true;
}